

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O1

void __thiscall libtorrent::aux::utp_socket_impl::tick(utp_socket_impl *this,time_point now)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  session_settings *psVar6;
  utp_socket_manager *puVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  packet *ppVar12;
  long lVar13;
  uint uVar14;
  index_type idx;
  undefined8 uVar15;
  unique_lock<std::mutex> local_40;
  
  if ((*(ushort *)&this->field_0x21c & 0x18) == 0x10) {
    return;
  }
  if ((long)now.__d.__r <= (this->m_timeout).__d.__r) {
    return;
  }
  uVar4 = this->m_acked_seq_nr;
  uVar2 = this->m_mtu_seq;
  bVar8 = false;
  if ((((uint16_t)(uVar4 + 1) == uVar2) && (bVar8 = false, uVar2 != 0)) &&
     (bVar8 = false, (uint16_t)(this->m_seq_nr - 1) == uVar2)) {
    this->m_mtu_ceiling = this->m_mtu - 1;
    update_mtu_limits(this);
    bVar8 = true;
  }
  if (((this->m_outbuf).m_size != 0) || (this->m_close_reason != none)) {
    if (!bVar8) {
      this->m_num_timeouts = this->m_num_timeouts + '\x01';
    }
    utp_socket_manager::inc_stats_counter(this->m_sm,0xa4,1);
  }
  bVar1 = this->m_num_timeouts;
  psVar6 = this->m_sm->m_sett;
  local_40._M_device = &psVar6->m_mutex;
  local_40._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar10 = (psVar6->m_store).m_ints._M_elems[0x5c];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (((int)(uint)bVar1 <= iVar10) &&
     ((this->m_num_timeouts == '\0' || (*(short *)&this->field_0x21c < 0)))) {
    if (!bVar8) {
      if (this->m_bytes_in_flight == 0) {
        uVar3 = this->m_mtu;
        if (this->m_cwnd >> 0x10 < (long)(ulong)uVar3) goto LAB_0039df6c;
        lVar11 = (this->m_cwnd * 2) / 3;
        lVar13 = (ulong)uVar3 * 0x10000;
        if (lVar11 == lVar13 ||
            SBORROW8(lVar11,lVar13) != (long)(lVar11 + (ulong)uVar3 * -0x10000) < 0) {
          lVar11 = lVar13;
        }
      }
      else {
LAB_0039df6c:
        lVar11 = (ulong)this->m_mtu << 0x10;
      }
      this->m_cwnd = lVar11;
      iVar10 = packet_timeout(this);
      (this->m_timeout).__d.__r = (long)iVar10 * 1000000 + (long)now.__d.__r;
      this->m_loss_seq_nr = this->m_seq_nr;
      this->field_0x21d = this->field_0x21d | 2;
    }
    this->m_mtu_seq = 0;
    idx = (index_type)this->m_acked_seq_nr;
    if (this->m_acked_seq_nr != (uint16_t)(this->m_seq_nr + 1)) {
      do {
        ppVar12 = packet_buffer::at(&this->m_outbuf,idx);
        if ((ppVar12 != (packet *)0x0) && ((ppVar12->field_0xe & 0x40) == 0)) {
          ppVar12->field_0xe = ppVar12->field_0xe | 0x40;
          this->m_bytes_in_flight =
               this->m_bytes_in_flight + ((uint)ppVar12->header_size - (uint)ppVar12->size);
        }
        uVar14 = idx + 1;
        idx = uVar14 & 0xffff;
      } while ((uint16_t)(this->m_seq_nr + 1) != (short)uVar14);
    }
    ppVar12 = packet_buffer::at(&this->m_outbuf,*(int *)&this->m_acked_seq_nr + 1U & 0xffff);
    if (ppVar12 == (packet *)0x0) {
      if ((*(ushort *)&this->field_0x21c & 0x1c) < 0xc) {
        send_pkt(this,0);
        return;
      }
      if ((*(ushort *)&this->field_0x21c & 0x1c) != 0xc) {
        return;
      }
      uVar15 = 0x100000002;
      if (((DAT_004fcee8 != -0x70502de1da3a1f65) && (DAT_004fcee8 != -0x4d54ee85da8120f3)) &&
         (cVar9 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                            (&boost::asio::error::get_misc_category()::instance,2), cVar9 == '\0'))
      {
        uVar15 = 2;
      }
      (this->m_error).val_ = (int)uVar15;
      (this->m_error).failed_ = (bool)(char)((ulong)uVar15 >> 0x20);
      *(int3 *)&(this->m_error).field_0x5 = (int3)((ulong)uVar15 >> 0x28);
      (this->m_error).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
      goto LAB_0039df1c;
    }
    bVar1 = ppVar12->field_0xe;
    iVar10 = utp_socket_manager::num_resends(this->m_sm);
    if ((((int)(bVar1 & 0x3f) < iVar10) &&
        (((*(ushort *)&this->field_0x21c & 0x1c) != 4 ||
         (bVar1 = ppVar12->field_0xe, iVar10 = utp_socket_manager::syn_resends(this->m_sm),
         (int)(bVar1 & 0x3f) < iVar10)))) &&
       (((*(ushort *)&this->field_0x21c & 0x1c) != 0xc ||
        (bVar1 = ppVar12->field_0xe, iVar10 = utp_socket_manager::fin_resends(this->m_sm),
        (int)(bVar1 & 0x3f) < iVar10)))) {
      uVar5 = this->m_acked_seq_nr;
      if (this->m_fast_resend_seq_nr == (uint16_t)(uVar5 + 1)) {
        this->m_fast_resend_seq_nr = this->m_fast_resend_seq_nr + 1;
      }
      resend_packet(this,ppVar12,false);
      return;
    }
    if (this->m_mtu_floor < ppVar12->size) {
      puVar7 = this->m_sm;
      (puVar7->m_restrict_mtu)._M_elems[puVar7->m_mtu_idx] = (uint)this->m_mtu;
      puVar7->m_mtu_idx = puVar7->m_mtu_idx + ((puVar7->m_mtu_idx + 1) / 3) * -3 + 1;
    }
  }
  (this->m_error).val_ = 0x6e;
  (this->m_error).failed_ = true;
  *(undefined3 *)&(this->m_error).field_0x5 = 0;
  (this->m_error).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
LAB_0039df1c:
  set_state(this,error_wait);
  test_socket_state(this);
  return;
}

Assistant:

state_t state() const { return static_cast<state_t>(m_state); }